

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer.cc
# Opt level: O3

void __thiscall Printer::~Printer(Printer *this)

{
  int iVar1;
  long lVar2;
  
  iVar1 = this->attrCount;
  if (0 < iVar1) {
    lVar2 = 0;
    do {
      if (this->psHeader[lVar2] != (char *)0x0) {
        operator_delete__(this->psHeader[lVar2]);
        iVar1 = this->attrCount;
      }
      lVar2 = lVar2 + 1;
    } while (lVar2 < iVar1);
  }
  if (this->spaces != (int *)0x0) {
    operator_delete__(this->spaces);
  }
  free(this->psHeader);
  if (this->attributes != (DataAttrInfo *)0x0) {
    operator_delete__(this->attributes);
    return;
  }
  return;
}

Assistant:

Printer::~Printer()
{
    for (int i = 0; i < attrCount; i++)
        delete [] psHeader[i];

    delete [] spaces;
    //delete [] psHeader;
    free (psHeader);
    delete [] attributes;
}